

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.h
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencySpacingEnabledModifier::~CurrencySpacingEnabledModifier
          (CurrencySpacingEnabledModifier *this)

{
  CurrencySpacingEnabledModifier *this_local;
  
  (this->super_ConstantMultiFieldModifier).super_Modifier._vptr_Modifier =
       (_func_int **)&PTR__CurrencySpacingEnabledModifier_004fe4c8;
  UnicodeString::~UnicodeString(&this->fBeforeSuffixInsert);
  UnicodeSet::~UnicodeSet(&this->fBeforeSuffixUnicodeSet);
  UnicodeString::~UnicodeString(&this->fAfterPrefixInsert);
  UnicodeSet::~UnicodeSet(&this->fAfterPrefixUnicodeSet);
  ConstantMultiFieldModifier::~ConstantMultiFieldModifier(&this->super_ConstantMultiFieldModifier);
  return;
}

Assistant:

class U_I18N_API CurrencySpacingEnabledModifier : public ConstantMultiFieldModifier {
  public:
    /** Safe code path */
    CurrencySpacingEnabledModifier(
            const NumberStringBuilder &prefix,
            const NumberStringBuilder &suffix,
            bool overwrite,
            bool strong,
            const DecimalFormatSymbols &symbols,
            UErrorCode &status);

    int32_t apply(NumberStringBuilder &output, int32_t leftIndex, int32_t rightIndex,
                  UErrorCode &status) const U_OVERRIDE;

    /** Unsafe code path */
    static int32_t
    applyCurrencySpacing(NumberStringBuilder &output, int32_t prefixStart, int32_t prefixLen,
                         int32_t suffixStart, int32_t suffixLen, const DecimalFormatSymbols &symbols,
                         UErrorCode &status);

  private:
    UnicodeSet fAfterPrefixUnicodeSet;
    UnicodeString fAfterPrefixInsert;
    UnicodeSet fBeforeSuffixUnicodeSet;
    UnicodeString fBeforeSuffixInsert;

    enum EAffix {
        PREFIX, SUFFIX
    };

    enum EPosition {
        IN_CURRENCY, IN_NUMBER
    };

    /** Unsafe code path */
    static int32_t applyCurrencySpacingAffix(NumberStringBuilder &output, int32_t index, EAffix affix,
                                             const DecimalFormatSymbols &symbols, UErrorCode &status);

    static UnicodeSet
    getUnicodeSet(const DecimalFormatSymbols &symbols, EPosition position, EAffix affix,
                  UErrorCode &status);

    static UnicodeString
    getInsertString(const DecimalFormatSymbols &symbols, EAffix affix, UErrorCode &status);
}